

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::GetObjectFromHandle
          (CSimpleHandleManager *this,CPalThread *pThread,HANDLE h,DWORD *pdwRightsGranted,
          IPalObject **ppObject)

{
  bool bVar1;
  HANDLE_INDEX HVar2;
  HANDLE_INDEX hi;
  PAL_ERROR palError;
  IPalObject **ppObject_local;
  DWORD *pdwRightsGranted_local;
  HANDLE h_local;
  CPalThread *pThread_local;
  CSimpleHandleManager *this_local;
  
  hi._4_4_ = 0;
  Lock(this,pThread);
  bVar1 = ValidateHandle(this,h);
  if (bVar1) {
    HVar2 = HandleToHandleIndex(this,h);
    *pdwRightsGranted = this->m_rghteHandleTable[HVar2].dwAccessRights;
    *ppObject = (IPalObject *)this->m_rghteHandleTable[HVar2].u;
    (*(*ppObject)->_vptr_IPalObject[7])();
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    hi._4_4_ = 6;
  }
  Unlock(this,pThread);
  return hi._4_4_;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::GetObjectFromHandle(
    CPalThread *pThread,
    HANDLE h,
    DWORD *pdwRightsGranted,
    IPalObject **ppObject
    )
{
    PAL_ERROR palError = NO_ERROR;
    HANDLE_INDEX hi;

    Lock(pThread);
    
    if (!ValidateHandle(h))
    {
        ERROR("Tried to dereference an invalid handle %p\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto GetObjectFromHandleExit;
    }
    
    hi = HandleToHandleIndex(h);

    *pdwRightsGranted = m_rghteHandleTable[hi].dwAccessRights;
    *ppObject = m_rghteHandleTable[hi].u.pObject;
    (*ppObject)->AddReference();
    
GetObjectFromHandleExit:

    Unlock(pThread);

    return palError;
}